

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall cfd::TransactionContext::IgnoreVerify(TransactionContext *this,OutPoint *outpoint)

{
  bool bVar1;
  uint32_t uVar2;
  OutPoint *in_RSI;
  long *in_RDI;
  OutPoint *in_stack_ffffffffffffffc8;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *in_stack_ffffffffffffffd0;
  OutPoint *in_stack_ffffffffffffffd8;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *in_stack_ffffffffffffffe0;
  TransactionContext *in_stack_ffffffffffffffe8;
  
  core::OutPoint::GetTxid((Txid *)&stack0xffffffffffffffd0,in_RSI);
  uVar2 = core::OutPoint::GetVout(in_RSI);
  (**(code **)(*in_RDI + 0x10))(in_RDI,&stack0xffffffffffffffd0,uVar2);
  core::Txid::~Txid((Txid *)0x53b438);
  bVar1 = IsFindOutPoint(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                         in_stack_ffffffffffffffd8);
  if (!bVar1) {
    std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
    emplace_back<cfd::core::OutPoint_const&>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void TransactionContext::IgnoreVerify(const OutPoint& outpoint) {
  GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  if (!IsFindOutPoint(verify_ignore_map_, outpoint)) {
    verify_ignore_map_.emplace_back(outpoint);
  }
}